

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_framing.c
# Opt level: O2

int amqp_decode_properties(uint16_t class_id,amqp_pool_t *pool,amqp_bytes_t encoded,void **decoded)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  size_t o_1;
  uint *puVar4;
  ulong uVar5;
  byte bVar6;
  void *pvVar7;
  ulong uVar8;
  uint uVar9;
  size_t o;
  ulong uVar10;
  ulong uVar11;
  ulong local_48;
  void **local_40;
  amqp_pool_t *local_38;
  
  pvVar7 = encoded.bytes;
  uVar8 = encoded.len;
  bVar6 = 0;
  uVar9 = 0;
  uVar11 = 1;
  do {
    uVar5 = uVar11;
    if (uVar8 < uVar5 + 1) {
      return -2;
    }
    uVar1 = *(ushort *)((long)pvVar7 + (uVar5 - 1));
    uVar2 = uVar1 >> 8;
    uVar9 = uVar9 | (uint)(ushort)(uVar1 << 8 | uVar2) << (bVar6 & 0x1f);
    uVar11 = uVar5 + 2;
    bVar6 = bVar6 + 0x10;
  } while ((uVar2 & 1) != 0);
  uVar10 = uVar5 + 1;
  local_48 = uVar10;
  local_40 = decoded;
  if ((((class_id != 0x5a) && (class_id != 0x14)) && (class_id != 0x1e)) &&
     ((class_id != 0x28 && (class_id != 0x32)))) {
    if (class_id == 0x3c) {
      local_38 = pool;
      puVar4 = (uint *)amqp_pool_alloc(pool,200);
      if (puVar4 == (uint *)0x0) {
        return -1;
      }
      *puVar4 = uVar9;
      if ((short)uVar9 < 0) {
        if (uVar8 < uVar11) {
          return -2;
        }
        uVar5 = (ulong)*(byte *)((long)pvVar7 + uVar5 + 1);
        uVar10 = uVar5 + uVar11;
        if (uVar8 < uVar10) {
          return -2;
        }
        *(ulong *)(puVar4 + 4) = uVar11 + (long)pvVar7;
        *(ulong *)(puVar4 + 2) = uVar5;
        local_48 = uVar10;
      }
      if ((uVar9 >> 0xe & 1) != 0) {
        uVar11 = uVar10 + 1;
        if (uVar8 < uVar11) {
          return -2;
        }
        bVar6 = *(byte *)((long)pvVar7 + uVar10);
        local_48 = uVar11 + bVar6;
        if (uVar8 < local_48) {
          return -2;
        }
        *(ulong *)(puVar4 + 8) = uVar11 + (long)pvVar7;
        *(ulong *)(puVar4 + 6) = (ulong)bVar6;
      }
      if (((uVar9 >> 0xd & 1) != 0) &&
         (iVar3 = amqp_decode_table(encoded,local_38,(amqp_table_t *)(puVar4 + 10),&local_48),
         iVar3 < 0)) {
        return iVar3;
      }
      if ((uVar9 >> 0xc & 1) != 0) {
        if (uVar8 < local_48 + 1) {
          return -2;
        }
        *(undefined1 *)(puVar4 + 0xe) = *(undefined1 *)((long)pvVar7 + local_48);
        local_48 = local_48 + 1;
      }
      if ((uVar9 >> 0xb & 1) != 0) {
        if (uVar8 < local_48 + 1) {
          return -2;
        }
        *(undefined1 *)((long)puVar4 + 0x39) = *(undefined1 *)((long)pvVar7 + local_48);
        local_48 = local_48 + 1;
      }
      if ((uVar9 >> 10 & 1) != 0) {
        uVar11 = local_48 + 1;
        if (uVar8 < uVar11) {
          return -2;
        }
        bVar6 = *(byte *)((long)pvVar7 + local_48);
        local_48 = uVar11 + bVar6;
        if (uVar8 < local_48) {
          return -2;
        }
        *(ulong *)(puVar4 + 0x12) = uVar11 + (long)pvVar7;
        *(ulong *)(puVar4 + 0x10) = (ulong)bVar6;
      }
      if ((uVar9 >> 9 & 1) != 0) {
        uVar11 = local_48 + 1;
        if (uVar8 < uVar11) {
          return -2;
        }
        bVar6 = *(byte *)((long)pvVar7 + local_48);
        local_48 = uVar11 + bVar6;
        if (uVar8 < local_48) {
          return -2;
        }
        *(ulong *)(puVar4 + 0x16) = uVar11 + (long)pvVar7;
        *(ulong *)(puVar4 + 0x14) = (ulong)bVar6;
      }
      if ((uVar9 >> 8 & 1) != 0) {
        uVar11 = local_48 + 1;
        if (uVar8 < uVar11) {
          return -2;
        }
        bVar6 = *(byte *)((long)pvVar7 + local_48);
        local_48 = uVar11 + bVar6;
        if (uVar8 < local_48) {
          return -2;
        }
        *(ulong *)(puVar4 + 0x1a) = uVar11 + (long)pvVar7;
        *(ulong *)(puVar4 + 0x18) = (ulong)bVar6;
      }
      if ((char)uVar9 < '\0') {
        uVar11 = local_48 + 1;
        if (uVar8 < uVar11) {
          return -2;
        }
        bVar6 = *(byte *)((long)pvVar7 + local_48);
        local_48 = uVar11 + bVar6;
        if (uVar8 < local_48) {
          return -2;
        }
        *(ulong *)(puVar4 + 0x1e) = uVar11 + (long)pvVar7;
        *(ulong *)(puVar4 + 0x1c) = (ulong)bVar6;
      }
      if ((uVar9 & 0x40) != 0) {
        if (uVar8 < local_48 + 8) {
          return -2;
        }
        uVar11 = *(ulong *)((long)pvVar7 + local_48);
        *(ulong *)(puVar4 + 0x20) =
             uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
             (uVar11 & 0xff0000000000) >> 0x18 | (uVar11 & 0xff00000000) >> 8 |
             (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 | (uVar11 & 0xff00) << 0x28 |
             uVar11 << 0x38;
        local_48 = local_48 + 8;
      }
      if ((uVar9 & 0x20) != 0) {
        uVar11 = local_48 + 1;
        if (uVar8 < uVar11) {
          return -2;
        }
        bVar6 = *(byte *)((long)pvVar7 + local_48);
        local_48 = uVar11 + bVar6;
        if (uVar8 < local_48) {
          return -2;
        }
        *(ulong *)(puVar4 + 0x24) = uVar11 + (long)pvVar7;
        *(ulong *)(puVar4 + 0x22) = (ulong)bVar6;
      }
      if ((uVar9 & 0x10) != 0) {
        uVar11 = local_48 + 1;
        if (uVar8 < uVar11) {
          return -2;
        }
        bVar6 = *(byte *)((long)pvVar7 + local_48);
        local_48 = uVar11 + bVar6;
        if (uVar8 < local_48) {
          return -2;
        }
        *(ulong *)(puVar4 + 0x28) = uVar11 + (long)pvVar7;
        *(ulong *)(puVar4 + 0x26) = (ulong)bVar6;
      }
      if ((uVar9 & 8) != 0) {
        uVar11 = local_48 + 1;
        if (uVar8 < uVar11) {
          return -2;
        }
        bVar6 = *(byte *)((long)pvVar7 + local_48);
        local_48 = uVar11 + bVar6;
        if (uVar8 < local_48) {
          return -2;
        }
        *(ulong *)(puVar4 + 0x2c) = uVar11 + (long)pvVar7;
        *(ulong *)(puVar4 + 0x2a) = (ulong)bVar6;
      }
      if ((uVar9 & 4) != 0) {
        uVar11 = local_48 + 1;
        if (uVar8 < uVar11) {
          return -2;
        }
        bVar6 = *(byte *)((long)pvVar7 + local_48);
        if (uVar8 < uVar11 + bVar6) {
          return -2;
        }
        *(ulong *)(puVar4 + 0x30) = (long)pvVar7 + uVar11;
        *(ulong *)(puVar4 + 0x2e) = (ulong)bVar6;
      }
      goto LAB_00105d02;
    }
    if ((class_id != 0x55) && (class_id != 10)) {
      return -3;
    }
  }
  puVar4 = (uint *)amqp_pool_alloc(pool,8);
  if (puVar4 == (uint *)0x0) {
    return -1;
  }
  *puVar4 = uVar9;
LAB_00105d02:
  *local_40 = puVar4;
  return 0;
}

Assistant:

int amqp_decode_properties(uint16_t class_id, amqp_pool_t *pool,
                           amqp_bytes_t encoded, void **decoded) {
  size_t offset = 0;

  amqp_flags_t flags = 0;
  int flagword_index = 0;
  uint16_t partial_flags;

  do {
    if (!amqp_decode_16(encoded, &offset, &partial_flags))
      return AMQP_STATUS_BAD_AMQP_DATA;
    flags |= (partial_flags << (flagword_index * 16));
    flagword_index++;
  } while (partial_flags & 1);

  switch (class_id) {
    case 10: {
      amqp_connection_properties_t *p =
          (amqp_connection_properties_t *)amqp_pool_alloc(
              pool, sizeof(amqp_connection_properties_t));
      if (p == NULL) {
        return AMQP_STATUS_NO_MEMORY;
      }
      p->_flags = flags;
      *decoded = p;
      return 0;
    }
    case 20: {
      amqp_channel_properties_t *p =
          (amqp_channel_properties_t *)amqp_pool_alloc(
              pool, sizeof(amqp_channel_properties_t));
      if (p == NULL) {
        return AMQP_STATUS_NO_MEMORY;
      }
      p->_flags = flags;
      *decoded = p;
      return 0;
    }
    case 30: {
      amqp_access_properties_t *p = (amqp_access_properties_t *)amqp_pool_alloc(
          pool, sizeof(amqp_access_properties_t));
      if (p == NULL) {
        return AMQP_STATUS_NO_MEMORY;
      }
      p->_flags = flags;
      *decoded = p;
      return 0;
    }
    case 40: {
      amqp_exchange_properties_t *p =
          (amqp_exchange_properties_t *)amqp_pool_alloc(
              pool, sizeof(amqp_exchange_properties_t));
      if (p == NULL) {
        return AMQP_STATUS_NO_MEMORY;
      }
      p->_flags = flags;
      *decoded = p;
      return 0;
    }
    case 50: {
      amqp_queue_properties_t *p = (amqp_queue_properties_t *)amqp_pool_alloc(
          pool, sizeof(amqp_queue_properties_t));
      if (p == NULL) {
        return AMQP_STATUS_NO_MEMORY;
      }
      p->_flags = flags;
      *decoded = p;
      return 0;
    }
    case 60: {
      amqp_basic_properties_t *p = (amqp_basic_properties_t *)amqp_pool_alloc(
          pool, sizeof(amqp_basic_properties_t));
      if (p == NULL) {
        return AMQP_STATUS_NO_MEMORY;
      }
      p->_flags = flags;
      if (flags & AMQP_BASIC_CONTENT_TYPE_FLAG) {
        {
          uint8_t len;
          if (!amqp_decode_8(encoded, &offset, &len) ||
              !amqp_decode_bytes(encoded, &offset, &p->content_type, len))
            return AMQP_STATUS_BAD_AMQP_DATA;
        }
      }
      if (flags & AMQP_BASIC_CONTENT_ENCODING_FLAG) {
        {
          uint8_t len;
          if (!amqp_decode_8(encoded, &offset, &len) ||
              !amqp_decode_bytes(encoded, &offset, &p->content_encoding, len))
            return AMQP_STATUS_BAD_AMQP_DATA;
        }
      }
      if (flags & AMQP_BASIC_HEADERS_FLAG) {
        {
          int res = amqp_decode_table(encoded, pool, &(p->headers), &offset);
          if (res < 0) return res;
        }
      }
      if (flags & AMQP_BASIC_DELIVERY_MODE_FLAG) {
        if (!amqp_decode_8(encoded, &offset, &p->delivery_mode))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      if (flags & AMQP_BASIC_PRIORITY_FLAG) {
        if (!amqp_decode_8(encoded, &offset, &p->priority))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      if (flags & AMQP_BASIC_CORRELATION_ID_FLAG) {
        {
          uint8_t len;
          if (!amqp_decode_8(encoded, &offset, &len) ||
              !amqp_decode_bytes(encoded, &offset, &p->correlation_id, len))
            return AMQP_STATUS_BAD_AMQP_DATA;
        }
      }
      if (flags & AMQP_BASIC_REPLY_TO_FLAG) {
        {
          uint8_t len;
          if (!amqp_decode_8(encoded, &offset, &len) ||
              !amqp_decode_bytes(encoded, &offset, &p->reply_to, len))
            return AMQP_STATUS_BAD_AMQP_DATA;
        }
      }
      if (flags & AMQP_BASIC_EXPIRATION_FLAG) {
        {
          uint8_t len;
          if (!amqp_decode_8(encoded, &offset, &len) ||
              !amqp_decode_bytes(encoded, &offset, &p->expiration, len))
            return AMQP_STATUS_BAD_AMQP_DATA;
        }
      }
      if (flags & AMQP_BASIC_MESSAGE_ID_FLAG) {
        {
          uint8_t len;
          if (!amqp_decode_8(encoded, &offset, &len) ||
              !amqp_decode_bytes(encoded, &offset, &p->message_id, len))
            return AMQP_STATUS_BAD_AMQP_DATA;
        }
      }
      if (flags & AMQP_BASIC_TIMESTAMP_FLAG) {
        if (!amqp_decode_64(encoded, &offset, &p->timestamp))
          return AMQP_STATUS_BAD_AMQP_DATA;
      }
      if (flags & AMQP_BASIC_TYPE_FLAG) {
        {
          uint8_t len;
          if (!amqp_decode_8(encoded, &offset, &len) ||
              !amqp_decode_bytes(encoded, &offset, &p->type, len))
            return AMQP_STATUS_BAD_AMQP_DATA;
        }
      }
      if (flags & AMQP_BASIC_USER_ID_FLAG) {
        {
          uint8_t len;
          if (!amqp_decode_8(encoded, &offset, &len) ||
              !amqp_decode_bytes(encoded, &offset, &p->user_id, len))
            return AMQP_STATUS_BAD_AMQP_DATA;
        }
      }
      if (flags & AMQP_BASIC_APP_ID_FLAG) {
        {
          uint8_t len;
          if (!amqp_decode_8(encoded, &offset, &len) ||
              !amqp_decode_bytes(encoded, &offset, &p->app_id, len))
            return AMQP_STATUS_BAD_AMQP_DATA;
        }
      }
      if (flags & AMQP_BASIC_CLUSTER_ID_FLAG) {
        {
          uint8_t len;
          if (!amqp_decode_8(encoded, &offset, &len) ||
              !amqp_decode_bytes(encoded, &offset, &p->cluster_id, len))
            return AMQP_STATUS_BAD_AMQP_DATA;
        }
      }
      *decoded = p;
      return 0;
    }
    case 90: {
      amqp_tx_properties_t *p = (amqp_tx_properties_t *)amqp_pool_alloc(
          pool, sizeof(amqp_tx_properties_t));
      if (p == NULL) {
        return AMQP_STATUS_NO_MEMORY;
      }
      p->_flags = flags;
      *decoded = p;
      return 0;
    }
    case 85: {
      amqp_confirm_properties_t *p =
          (amqp_confirm_properties_t *)amqp_pool_alloc(
              pool, sizeof(amqp_confirm_properties_t));
      if (p == NULL) {
        return AMQP_STATUS_NO_MEMORY;
      }
      p->_flags = flags;
      *decoded = p;
      return 0;
    }
    default:
      return AMQP_STATUS_UNKNOWN_CLASS;
  }
}